

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.H
# Opt level: O0

Array<const_MultiFab_*,_3> * __thiscall
amrex::MLEBABecLap::getBCoeffs(MLEBABecLap *this,int amrlev,int mglev)

{
  array<amrex::MultiFab,_3UL> *in_RDI;
  size_type in_stack_ffffffffffffffd8;
  array<amrex::MultiFab,_3UL> *a;
  
  a = in_RDI;
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_RDI,in_stack_ffffffffffffffd8);
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)a,in_stack_ffffffffffffffd8);
  GetArrOfConstPtrs<amrex::MultiFab>(a);
  return (Array<const_MultiFab_*,_3> *)in_RDI;
}

Assistant:

virtual Array<MultiFab const*,AMREX_SPACEDIM> getBCoeffs (int amrlev, int mglev) const final override
        { return amrex::GetArrOfConstPtrs(m_b_coeffs[amrlev][mglev]); }